

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void nodeOverwriteCell(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell,int iCell)

{
  byte bVar1;
  u8 *puVar2;
  int iVar3;
  u8 *local_30;
  u8 *p;
  int ii;
  int iCell_local;
  RtreeCell *pCell_local;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  puVar2 = pNode->zData;
  bVar1 = pRtree->nBytesPerCell;
  iVar3 = writeInt64(puVar2 + (int)((uint)bVar1 * iCell + 4),pCell->iRowid);
  local_30 = puVar2 + (int)((uint)bVar1 * iCell + 4) + iVar3;
  for (p._0_4_ = 0; (int)p < (int)(uint)pRtree->nDim2; p._0_4_ = (int)p + 1) {
    iVar3 = writeCoord(local_30,pCell->aCoord + (int)p);
    local_30 = local_30 + iVar3;
  }
  pNode->isDirty = 1;
  return;
}

Assistant:

static void nodeOverwriteCell(
  Rtree *pRtree,             /* The overall R-Tree */
  RtreeNode *pNode,          /* The node into which the cell is to be written */
  RtreeCell *pCell,          /* The cell to write */
  int iCell                  /* Index into pNode into which pCell is written */
){
  int ii;
  u8 *p = &pNode->zData[4 + pRtree->nBytesPerCell*iCell];
  p += writeInt64(p, pCell->iRowid);
  for(ii=0; ii<pRtree->nDim2; ii++){
    p += writeCoord(p, &pCell->aCoord[ii]);
  }
  pNode->isDirty = 1;
}